

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O2

void __thiscall
General_connectionDisconnectDirectly_Test::~General_connectionDisconnectDirectly_Test
          (General_connectionDisconnectDirectly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(General, connectionDisconnectDirectly)
{
  sigs::Signal<void(int &)> s;
  auto conn = s.connect([](int &i) { i++; });

  int i = 0;
  s(i);
  EXPECT_EQ(i, 1);

  conn->disconnect();

  s(i);
  EXPECT_EQ(i, 1);
}